

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<unsigned_long>(uint length,unsigned_long value)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint i;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  shared_ptr<unsigned_long> pa;
  shared_ptr<unsigned_long> pb;
  
  uVar1 = (ulong)length;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar4 = (long)(int)(length + 1) * 8;
  }
  pvVar3 = operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,pvVar3,
             nosimd::common::free<unsigned_long>);
  pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_long>);
  _Var2._M_pi = pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined8 *)((long)pvVar3 + uVar1 * 8) = 0x7f;
  (&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar1] = (_func_int **)0x3f;
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(unsigned_long *)((long)pvVar3 + uVar4 * 8) = value;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(unsigned_long *)((long)pvVar3 + lVar5 * 8) != value) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = unsigned long]";
        *(undefined4 *)(puVar7 + 1) = 0x16;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      (&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar4] = *(_func_int ***)((long)pvVar3 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if ((&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar5] != (_func_int **)value) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = unsigned long]";
        *(undefined4 *)(puVar7 + 1) = 0x1d;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if (0 < (int)length) {
    memset(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
           uVar1 * 8);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if ((&(_Var2._M_pi)->_vptr__Sp_counted_base)[lVar5] != (_func_int **)0x0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = unsigned long]";
        *(undefined4 *)(puVar7 + 1) = 0x24;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
    uVar4 = 0;
    do {
      *(ulong *)((long)pvVar3 + uVar4 * 8) = uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      (&(_Var2._M_pi)->_vptr__Sp_counted_base)[uVar4] = *(_func_int ***)((long)pvVar3 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    pp_Var6 = (_func_int **)0x0;
    do {
      if (pp_Var6 != (&(_Var2._M_pi)->_vptr__Sp_counted_base)[(long)pp_Var6]) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = unsigned long]";
        *(undefined4 *)(puVar7 + 1) = 0x2d;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
    } while (length != (uint)pp_Var6);
  }
  if ((*(long *)((long)pvVar3 + uVar1 * 8) == 0x7f) &&
     ((&(_Var2._M_pi)->_vptr__Sp_counted_base)[uVar1] == (_func_int **)0x3f)) {
    if (pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar7 = "void test_common(unsigned int, T) [T = unsigned long]";
  *(undefined4 *)(puVar7 + 1) = 0x31;
  *(uint *)((long)puVar7 + 0xc) = length;
  __cxa_throw(puVar7,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}